

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ObjPrepareCi(Nf_Man_t *p,int iObj,int Time)

{
  undefined1 *puVar1;
  Nf_Mat_t (*paNVar2) [2];
  Nf_Obj_t *pNVar3;
  
  pNVar3 = p->pNfObjs;
  pNVar3[iObj].M[0][1].D = Time;
  pNVar3[iObj].M[0][0].D = Time;
  puVar1 = &pNVar3[iObj].M[1][0].field_0x3;
  *puVar1 = *puVar1 | 0x40;
  pNVar3[iObj].M[1][0].D = p->InvDelayI + Time;
  pNVar3[iObj].M[1][0].F = p->InvAreaF;
  puVar1 = &pNVar3[iObj].M[1][1].field_0x3;
  *puVar1 = *puVar1 | 0x40;
  pNVar3[iObj].M[1][1].D = Time + p->InvDelayI;
  pNVar3[iObj].M[1][1].F = p->InvAreaF;
  *(uint *)p->pNfObjs[iObj].M[0] = *(uint *)p->pNfObjs[iObj].M[0] | 0x80000000;
  paNVar2 = p->pNfObjs[iObj].M + 1;
  *(uint *)*paNVar2 = *(uint *)*paNVar2 | 0x80000000;
  return;
}

Assistant:

static inline void Nf_ObjPrepareCi( Nf_Man_t * p, int iObj, int Time )
{
    Nf_Mat_t * pD0 = Nf_ObjMatchD( p, iObj, 0 );
    Nf_Mat_t * pA0 = Nf_ObjMatchA( p, iObj, 0 );
    Nf_Mat_t * pD = Nf_ObjMatchD( p, iObj, 1 );
    Nf_Mat_t * pA = Nf_ObjMatchA( p, iObj, 1 );
    pD0->D = pA0->D = pD->D = pA->D = Time;
    pD->fCompl = 1;
    pD->D += p->InvDelayI;
    pD->F = p->InvAreaF;
    pA->fCompl = 1;
    pA->D += p->InvDelayI;
    pA->F = p->InvAreaF;
    Nf_ObjMatchD( p, iObj, 0 )->fBest = 1;
    Nf_ObjMatchD( p, iObj, 1 )->fBest = 1;
}